

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

int __thiscall TPZSFMatrix<double>::Clear(TPZSFMatrix<double> *this)

{
  if (this->fElem != (double *)0x0) {
    operator_delete(this->fElem,8);
  }
  this->fElem = (double *)0x0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Clear()
{
	if ( fElem != NULL )
		delete( fElem );
	
	fElem = NULL;
	this->fRow = this->fCol = 0;
	return( 1 );
}